

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_default_vfs_open_w
                    (ma_vfs *pVFS,wchar_t *pFilePath,ma_uint32 openMode,ma_vfs_file *pFile)

{
  ma_vfs_file *pFile_local;
  ma_uint32 openMode_local;
  wchar_t *pFilePath_local;
  ma_vfs *pVFS_local;
  
  if (pFile == (ma_vfs_file *)0x0) {
    pVFS_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    *pFile = (ma_vfs_file)0x0;
    if ((pFilePath == (wchar_t *)0x0) || (openMode == 0)) {
      pVFS_local._4_4_ = MA_INVALID_ARGS;
    }
    else {
      pVFS_local._4_4_ = ma_default_vfs_open_w__stdio(pVFS,pFilePath,openMode,pFile);
    }
  }
  return pVFS_local._4_4_;
}

Assistant:

static ma_result ma_default_vfs_open_w(ma_vfs* pVFS, const wchar_t* pFilePath, ma_uint32 openMode, ma_vfs_file* pFile)
{
    if (pFile == NULL) {
        return MA_INVALID_ARGS;
    }

    *pFile = NULL;

    if (pFilePath == NULL || openMode == 0) {
        return MA_INVALID_ARGS;
    }

#if defined(MA_WIN32) && defined(MA_WIN32_DESKTOP) && !defined(MA_NO_WIN32_FILEIO)
    return ma_default_vfs_open_w__win32(pVFS, pFilePath, openMode, pFile);
#else
    return ma_default_vfs_open_w__stdio(pVFS, pFilePath, openMode, pFile);
#endif
}